

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PopStyleVar(int count)

{
  int iVar1;
  ImGuiContext *pIVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  pIVar2 = GImGui;
  if (0 < count) {
    iVar4 = (GImGui->StyleVarStack).Size;
    piVar3 = (GImGui->StyleVarStack).Data[(long)iVar4 + -1].field_1.BackupInt + 1;
    iVar5 = count + 1;
    do {
      iVar4 = iVar4 + -1;
      iVar1 = piVar3[-2];
      if (GStyleVarInfo[iVar1].Type == 8) {
        uVar6 = (ulong)GStyleVarInfo[iVar1].Offset;
        if (GStyleVarInfo[iVar1].Count == 1) {
          *(int *)((long)&(pIVar2->Style).Alpha + uVar6) = piVar3[-1];
        }
        else if (GStyleVarInfo[iVar1].Count == 2) {
          *(int *)((long)&(pIVar2->Style).Alpha + uVar6) = piVar3[-1];
          *(int *)((long)&(pIVar2->Style).WindowPadding.x + uVar6) = *piVar3;
        }
      }
      (pIVar2->StyleVarStack).Size = iVar4;
      piVar3 = piVar3 + -3;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  return;
}

Assistant:

void ImGui::PopStyleVar(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        // We avoid a generic memcpy(data, &backup.Backup.., GDataTypeSize[info->Type] * info->Count), the overhead in Debug is not worth it.
        ImGuiStyleMod& backup = g.StyleVarStack.back();
        const ImGuiStyleVarInfo* info = GetStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&g.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1)      { ((float*)data)[0] = backup.BackupFloat[0]; }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) { ((float*)data)[0] = backup.BackupFloat[0]; ((float*)data)[1] = backup.BackupFloat[1]; }
        g.StyleVarStack.pop_back();
        count--;
    }
}